

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

BaseStatistics * __thiscall
duckdb::BaseStatistics::Copy(BaseStatistics *__return_storage_ptr__,BaseStatistics *this)

{
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,&this->type);
  BaseStatistics(__return_storage_ptr__,&local_30);
  LogicalType::~LogicalType(&local_30);
  Copy(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics BaseStatistics::Copy() const {
	BaseStatistics result(type);
	result.Copy(*this);
	return result;
}